

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PortSymbol::getNetTypes
          (PortSymbol *this,SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *ranges)

{
  Expression *pEVar1;
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *in_RSI;
  Type *in_RDI;
  NetType *nt;
  Expression *ie;
  PortSymbol *in_stack_000001c8;
  NetTypeRange *in_stack_ffffffffffffffb8;
  PortSymbol *in_stack_ffffffffffffffc0;
  
  pEVar1 = getInternalExpr(in_stack_ffffffffffffffc0);
  if (pEVar1 == (Expression *)0x0) {
    if ((in_RDI->canonical != (Type *)0x0) && ((in_RDI->canonical->super_Symbol).kind == Net)) {
      Symbol::as<slang::ast::NetSymbol>((Symbol *)0x7a2c53);
      getType(in_stack_000001c8);
      Type::getBitWidth(in_RDI);
      SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::push_back
                (in_RSI,in_stack_ffffffffffffffb8);
    }
  }
  else {
    getNetRanges(ie,(SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)nt);
  }
  return;
}

Assistant:

void PortSymbol::getNetTypes(SmallVectorBase<NetTypeRange>& ranges) const {
    if (auto ie = getInternalExpr()) {
        getNetRanges(*ie, ranges);
    }
    else if (internalSymbol && internalSymbol->kind == SymbolKind::Net) {
        auto& nt = internalSymbol->as<NetSymbol>().netType;
        ranges.push_back({&nt, getType().getBitWidth()});
    }
}